

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::Interpreter::BaAvailabilityToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,uint32_t aAvailability)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if ((int)this == 1) {
    pcVar2 = "high";
    paVar1 = &local_a;
  }
  else if ((int)this == 0) {
    pcVar2 = "low";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "reserved";
    paVar1 = &local_b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::BaAvailabilityToString(uint32_t aAvailability)
{
    switch (aAvailability)
    {
    case 0:
        return "low";
    case 1:
        return "high";
    default:
        return "reserved";
    }
}